

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

string * __thiscall
rcg::loadFile_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          char *name,bool exception)

{
  char cVar1;
  ulong uVar2;
  void *__s;
  long lVar3;
  invalid_argument *this_00;
  long *plVar4;
  char *pcVar5;
  long *plVar6;
  long lVar7;
  value_type *__val;
  uint uVar8;
  FileProtocolAdapter rf;
  FileProtocolAdapter local_88 [16];
  rcg *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GenApi_3_4::FileProtocolAdapter::FileProtocolAdapter(local_88);
  GenApi_3_4::FileProtocolAdapter::attach((INodeMap *)local_88);
  cVar1 = GenApi_3_4::FileProtocolAdapter::openFile((char *)local_88,(_Ios_Openmode)nodemap);
  if (cVar1 == '\0') {
    if ((char)name != '\0') {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Cannot open file for reading: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
      local_70 = (long *)*plVar4;
      plVar6 = plVar4 + 2;
      if (local_70 == plVar6) {
        local_60 = *plVar6;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar6;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(this_00,(string *)&local_70);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    local_78 = this;
    uVar2 = getInteger((shared_ptr<GenApi_3_4::CNodeMapRef> *)this,"FileSize",(int64_t *)0x0,
                       (int64_t *)0x0,true,false);
    __s = operator_new(0x200);
    memset(__s,0,0x200);
    if (0 < (int)uVar2) {
      lVar7 = 0;
      do {
        pcVar5 = (char *)0x200;
        if ((int)uVar2 < 0x200) {
          pcVar5 = (char *)(uVar2 & 0xffffffff);
        }
        lVar3 = GenApi_3_4::FileProtocolAdapter::read((char *)local_88,(long)__s,lVar7,pcVar5);
        if (lVar3 == 0) {
          pcVar5 = (char *)getInteger((shared_ptr<GenApi_3_4::CNodeMapRef> *)local_78,
                                      "FileOperationResult",(int64_t *)0x0,(int64_t *)0x0,false,
                                      false);
          if (pcVar5 == (char *)0x0) {
            lVar3 = 0;
          }
          else {
            lVar3 = GenApi_3_4::FileProtocolAdapter::read((char *)local_88,(long)__s,lVar7,pcVar5);
          }
        }
        if (lVar3 == 0) break;
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s);
        lVar7 = lVar7 + lVar3;
        uVar8 = (int)uVar2 - (int)lVar3;
        uVar2 = (ulong)uVar8;
      } while (0 < (int)uVar8);
    }
    GenApi_3_4::FileProtocolAdapter::closeFile((char *)local_88);
    operator_delete(__s);
  }
  GenApi_3_4::FileProtocolAdapter::~FileProtocolAdapter(local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string loadFile(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                     bool exception)
{
  std::string ret;

  // load file in pieces of 512 bytes

  GenApi::FileProtocolAdapter rf;
  rf.attach(nodemap->_Ptr);

  if (rf.openFile(name, std::ios::in))
  {
    int length=std::numeric_limits<int>::max();
    try
    {
      // limit read operation to file size, if available
      length=rcg::getInteger(nodemap, "FileSize", 0, 0, true);
    }
    catch (const std::exception &)
    { }

    size_t off=0, n=512;
    std::vector<char> buffer(512);

    while (n > 0 && length > 0)
    {
      n=rf.read(buffer.data(), off, std::min(length, static_cast<int>(buffer.size())), name);

      if (n == 0)
      {
        // workaround for reading last partial block if camera reports failure

        n=rcg::getInteger(nodemap, "FileOperationResult");

        if (n > 0)
        {
          n=rf.read(buffer.data(), off, n, name);
        }
      }

      if (n > 0)
      {
        ret.append(buffer.data(), n);
      }

      off+=n;
      length-=n;
    }

    rf.closeFile(name);
  }
  else
  {
    if (exception)
    {
      throw std::invalid_argument(std::string("Cannot open file for reading: ")+name);
    }
  }

  return ret;
}